

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variables.cpp
# Opt level: O2

TVariableIndex __thiscall
Refal2::CVariablesBuilder::AddRight
          (CVariablesBuilder *this,TVariableName name,TVariableTypeTag type)

{
  int *piVar1;
  int iVar2;
  TVariableType type_00;
  bool bVar3;
  TVariableType TVar4;
  long lVar5;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar4 = checkTypeTag(this,type,(CQualifier **)0x0);
  iVar6 = -1;
  if (TVar4 != VT_None) {
    bVar3 = checkName(this,name);
    if (bVar3) {
      iVar2 = *(int *)(&(this->super_CErrorsHelper).field_0xa4 + (ulong)name * 4);
      lVar5 = (long)iVar2;
      if (lVar5 == -1) {
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_88,'\x01');
        std::operator+(&local_68,"variable `",&local_88);
        std::operator+(&local_48,&local_68,"` wasn\'t defined in left part of rule");
        error(this,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        std::__cxx11::string::~string((string *)&local_68);
        std::__cxx11::string::~string((string *)&local_88);
      }
      else {
        type_00 = this->variables[lVar5].Type;
        if (type_00 == TVar4) {
          piVar1 = &this->variables[lVar5].CountRight;
          *piVar1 = *piVar1 + 1;
          iVar6 = iVar2;
        }
        else {
          errorTypesNotMatched(this,name,type_00);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

TVariableIndex CVariablesBuilder::AddRight( const TVariableName name,
	const TVariableTypeTag type )
{
	const TVariableType variableType = checkTypeTag( type );
	if( variableType != VT_None && checkName( name ) ) {
		const TVariableIndex variableIndex = variableNameToIndex[name];
		if( variableIndex != InvalidVariableIndex ) {
			CVariableData& variable = variables[variableIndex];
			if( variable.Type == variableType ) {
				variable.CountRight++;
				return variableIndex;
			} else {
				errorTypesNotMatched( name, variable.Type );
			}
		} else {
			error( "variable `" + std::string( 1, static_cast<char>( name ) )
				+ "` wasn't defined in left part of rule" );
		}
	}
	return InvalidVariableIndex;
}